

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O0

int __thiscall qclab::qgates::CZ<float>::toQASM(CZ<float> *this,ostream *stream,int offset)

{
  ostream *poVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int qubit;
  int qubit_00;
  __string_type local_90;
  __string_type local_70;
  __string_type local_40;
  int local_1c;
  ostream *poStack_18;
  int offset_local;
  ostream *stream_local;
  CZ<float> *this_local;
  
  local_1c = offset;
  poStack_18 = stream;
  stream_local = (ostream *)this;
  iVar2 = QControlledGate2<float>::controlState(&this->super_QControlledGate2<float>);
  poVar1 = poStack_18;
  if (iVar2 == 0) {
    iVar2 = QControlledGate2<float>::control(&this->super_QControlledGate2<float>);
    qasmX_abi_cxx11_(&local_40,(qclab *)(ulong)(uint)(iVar2 + local_1c),qubit);
    std::operator<<(poVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = poStack_18;
  iVar2 = QControlledGate2<float>::control(&this->super_QControlledGate2<float>);
  uVar3 = iVar2 + local_1c;
  iVar2 = local_1c;
  iVar4 = (*(this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>.
            _vptr_QObject[0xf])();
  qasmCZ_abi_cxx11_(&local_70,(qclab *)(ulong)uVar3,iVar4 + local_1c,iVar2);
  std::operator<<(poVar1,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  iVar2 = QControlledGate2<float>::controlState(&this->super_QControlledGate2<float>);
  poVar1 = poStack_18;
  if (iVar2 == 0) {
    iVar2 = QControlledGate2<float>::control(&this->super_QControlledGate2<float>);
    qasmX_abi_cxx11_(&local_90,(qclab *)(ulong)(uint)(iVar2 + local_1c),qubit_00);
    std::operator<<(poVar1,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          if ( this->controlState() == 0 ) {
            stream << qasmX( this->control() + offset ) ;
          }
          stream << qasmCZ( this->control() + offset ,
                            this->target()  + offset ) ;
          if ( this->controlState() == 0 ) {
            stream << qasmX( this->control() + offset ) ;
          }
          return 0 ;
        }